

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMU_HA_Marshal(TPMU_HA *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_HA *source_local;
  
  switch(selector) {
  case 4:
    source_local._6_2_ = BYTE_Array_Marshal(source->sha1,buffer,size,0x14);
    break;
  default:
    source_local._6_2_ = 0;
    break;
  case 0xb:
    source_local._6_2_ = BYTE_Array_Marshal(source->sha1,buffer,size,0x20);
    break;
  case 0xc:
    source_local._6_2_ = BYTE_Array_Marshal(source->sha1,buffer,size,0x30);
    break;
  case 0xd:
    source_local._6_2_ = BYTE_Array_Marshal(source->sha1,buffer,size,0x40);
    break;
  case 0x10:
    source_local._6_2_ = 0;
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPMU_HA_Marshal(TPMU_HA *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_SHA1
        case TPM_ALG_SHA1:
            return BYTE_Array_Marshal((BYTE *)(source->sha1), buffer, size, (INT32)SHA1_DIGEST_SIZE);
#endif // ALG_SHA1
#if         ALG_SHA256
        case TPM_ALG_SHA256:
            return BYTE_Array_Marshal((BYTE *)(source->sha256), buffer, size, (INT32)SHA256_DIGEST_SIZE);
#endif // ALG_SHA256
#if         ALG_SHA384
        case TPM_ALG_SHA384:
            return BYTE_Array_Marshal((BYTE *)(source->sha384), buffer, size, (INT32)SHA384_DIGEST_SIZE);
#endif // ALG_SHA384
#if         ALG_SHA512
        case TPM_ALG_SHA512:
            return BYTE_Array_Marshal((BYTE *)(source->sha512), buffer, size, (INT32)SHA512_DIGEST_SIZE);
#endif // ALG_SHA512
#if         ALG_SM3_256
        case TPM_ALG_SM3_256:
            return BYTE_Array_Marshal((BYTE *)(source->sm3_256), buffer, size, (INT32)SM3_256_DIGEST_SIZE);
#endif // ALG_SM3_256
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}